

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_matrix.cpp
# Opt level: O3

void __thiscall neural_networks::utilities::NeuralMatrix::~NeuralMatrix(NeuralMatrix *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_Matrix<neural_networks::utilities::Neuron_*>)._vptr_Matrix =
       (_func_int **)&PTR_valid_0010bc38;
  uVar2 = (this->super_Matrix<neural_networks::utilities::Neuron_*>).N;
  if (uVar2 != 0) {
    uVar1 = (this->super_Matrix<neural_networks::utilities::Neuron_*>).M;
    uVar3 = 0;
    do {
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        uVar2 = 0;
        do {
          operator_delete(*(void **)(*(long *)&(this->
                                               super_Matrix<neural_networks::utilities::Neuron_*>).
                                               matrix.
                                               super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                               super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                               ._M_impl.super__Vector_impl_data + uVar2 * 8));
          *(undefined8 *)
           (*(long *)&(this->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                      super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3].
                      super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                      ._M_impl.super__Vector_impl_data + uVar2 * 8) = 0;
          uVar2 = uVar2 + 1;
          uVar1 = (this->super_Matrix<neural_networks::utilities::Neuron_*>).M;
        } while (uVar2 < uVar1);
        uVar2 = (this->super_Matrix<neural_networks::utilities::Neuron_*>).N;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  (this->super_Matrix<neural_networks::utilities::Neuron_*>)._vptr_Matrix =
       (_func_int **)&PTR_valid_0010bcf8;
  std::
  vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
  ::~vector(&(this->super_Matrix<neural_networks::utilities::Neuron_*>).matrix);
  return;
}

Assistant:

neural_networks::utilities::NeuralMatrix::~NeuralMatrix() {
    register size_t i, j;
    // size_t sum = 0;
    for(i = 0; i < N; ++i) {
        for(j = 0; j < M; ++j) {
            // sum += sizeof(matrix[i][j]);
            delete matrix[i][j];
            matrix[i][j] = nullptr;
        }
    }
    // std::cout << "Freed " << sum << "B of memory at " << this << "\n";
}